

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# threadstate.cpp
# Opt level: O2

void __thiscall
ThreadState::ThreadState(ThreadState *this,TID own_tid,shared_ptr<ThreadState> *parent)

{
  element_type *that;
  pair<unsigned_int,_unsigned_long> local_48;
  pair<phmap::container_internal::raw_hash_set<phmap::container_internal::FlatHashMapPolicy<unsigned_int,_unsigned_long>,_phmap::Hash<unsigned_int>,_phmap::EqualTo<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_long>_>_>::iterator,_bool>
  local_38;
  
  (this->super_VectorClock<std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>).vc.
  super_raw_hash_map<phmap::container_internal::FlatHashMapPolicy<unsigned_int,_unsigned_long>,_phmap::Hash<unsigned_int>,_phmap::EqualTo<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_long>_>_>
  .
  super_raw_hash_set<phmap::container_internal::FlatHashMapPolicy<unsigned_int,_unsigned_long>,_phmap::Hash<unsigned_int>,_phmap::EqualTo<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_long>_>_>
  .ctrl_ = phmap::container_internal::EmptyGroup()::empty_group;
  (this->super_VectorClock<std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>).vc.
  super_raw_hash_map<phmap::container_internal::FlatHashMapPolicy<unsigned_int,_unsigned_long>,_phmap::Hash<unsigned_int>,_phmap::EqualTo<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_long>_>_>
  .
  super_raw_hash_set<phmap::container_internal::FlatHashMapPolicy<unsigned_int,_unsigned_long>,_phmap::Hash<unsigned_int>,_phmap::EqualTo<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_long>_>_>
  .settings_.
  super_CompressedTupleImpl<phmap::container_internal::CompressedTuple<unsigned_long,_phmap::Hash<unsigned_int>,_phmap::EqualTo<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_long>_>_>,_phmap::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>_>
  .
  super_Storage<phmap::container_internal::CompressedTuple<unsigned_long,_phmap::Hash<unsigned_int>,_phmap::EqualTo<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_long>_>_>,_0UL,_false>
  .value = 0;
  (this->super_VectorClock<std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>).vc.
  super_raw_hash_map<phmap::container_internal::FlatHashMapPolicy<unsigned_int,_unsigned_long>,_phmap::Hash<unsigned_int>,_phmap::EqualTo<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_long>_>_>
  .
  super_raw_hash_set<phmap::container_internal::FlatHashMapPolicy<unsigned_int,_unsigned_long>,_phmap::Hash<unsigned_int>,_phmap::EqualTo<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_long>_>_>
  .slots_ = (slot_type *)0x0;
  (this->super_VectorClock<std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>).vc.
  super_raw_hash_map<phmap::container_internal::FlatHashMapPolicy<unsigned_int,_unsigned_long>,_phmap::Hash<unsigned_int>,_phmap::EqualTo<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_long>_>_>
  .
  super_raw_hash_set<phmap::container_internal::FlatHashMapPolicy<unsigned_int,_unsigned_long>,_phmap::Hash<unsigned_int>,_phmap::EqualTo<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_long>_>_>
  .size_ = 0;
  (this->super_VectorClock<std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>).vc.
  super_raw_hash_map<phmap::container_internal::FlatHashMapPolicy<unsigned_int,_unsigned_long>,_phmap::Hash<unsigned_int>,_phmap::EqualTo<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_long>_>_>
  .
  super_raw_hash_set<phmap::container_internal::FlatHashMapPolicy<unsigned_int,_unsigned_long>,_phmap::Hash<unsigned_int>,_phmap::EqualTo<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_long>_>_>
  .capacity_ = 0;
  (this->id).super___atomic_base<unsigned_long>._M_i = (ulong)own_tid << 0x20;
  StackTrace::StackTrace(&this->traceDepot);
  local_48.second = (this->id).super___atomic_base<unsigned_long>._M_i;
  local_48.first = own_tid;
  phmap::container_internal::
  raw_hash_set<phmap::container_internal::FlatHashMapPolicy<unsigned_int,_unsigned_long>,_phmap::Hash<unsigned_int>,_phmap::EqualTo<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_long>_>_>
  ::emplace<std::pair<unsigned_int,_unsigned_long>,_0>
            (&local_38,
             (raw_hash_set<phmap::container_internal::FlatHashMapPolicy<unsigned_int,_unsigned_long>,_phmap::Hash<unsigned_int>,_phmap::EqualTo<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_long>_>_>
              *)this,&local_48);
  that = (parent->super___shared_ptr<ThreadState,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  if (that != (element_type *)0x0) {
    phmap::container_internal::
    raw_hash_set<phmap::container_internal::FlatHashMapPolicy<unsigned_int,_unsigned_long>,_phmap::Hash<unsigned_int>,_phmap::EqualTo<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_long>_>_>
    ::operator=((raw_hash_set<phmap::container_internal::FlatHashMapPolicy<unsigned_int,_unsigned_long>,_phmap::Hash<unsigned_int>,_phmap::EqualTo<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_long>_>_>
                 *)this,(raw_hash_set<phmap::container_internal::FlatHashMapPolicy<unsigned_int,_unsigned_long>,_phmap::Hash<unsigned_int>,_phmap::EqualTo<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_long>_>_>
                         *)that);
  }
  return;
}

Assistant:

ThreadState::ThreadState(VectorClock::TID own_tid,
                         const std::shared_ptr<ThreadState>& parent)
    : id(VectorClock::make_id(own_tid)) {
  vc.insert({own_tid, id});
  if (parent != nullptr) {
    // if parent exists vector clock
    vc = parent->vc;
  }
}